

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general.c
# Opt level: O1

axbStatus_t axbOpBackendRegister(axbHandle_s *handle,axbOpBackend_s *ops)

{
  size_t sVar1;
  axbOpBackend_s **__ptr;
  axbOpBackend_s **ppaVar2;
  size_t sVar3;
  
  sVar1 = handle->opBackends_size;
  sVar3 = handle->opBackends_capacity;
  if (sVar1 == sVar3) {
    __ptr = handle->opBackends;
    handle->opBackends_capacity = sVar3 * 2;
    ppaVar2 = (axbOpBackend_s **)malloc(sVar3 << 4);
    handle->opBackends = ppaVar2;
    if (sVar1 != 0) {
      sVar3 = 0;
      do {
        handle->opBackends[sVar3] = __ptr[sVar3];
        sVar3 = sVar3 + 1;
      } while (sVar1 != sVar3);
    }
    free(__ptr);
  }
  sVar1 = handle->opBackends_size;
  handle->opBackends[sVar1] = ops;
  handle->opBackends_size = sVar1 + 1;
  return 0;
}

Assistant:

axbStatus_t axbOpBackendRegister(struct axbHandle_s *handle, struct axbOpBackend_s *ops)
{
  // check if there is still room for another backend. If not, resize array:
  if (handle->opBackends_size == handle->opBackends_capacity) {
    struct axbOpBackend_s **old_array = handle->opBackends;
    handle->opBackends_capacity *= 2;
    handle->opBackends = malloc(handle->opBackends_capacity * sizeof(struct axbOpBackend_s *));

    // copy over existing backends:
    for (size_t i=0; i<handle->opBackends_size; ++i) handle->opBackends[i] = old_array[i];
    free(old_array);
  }

  handle->opBackends[handle->opBackends_size] = ops;
  handle->opBackends_size += 1;
  return 0;
}